

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Point.cpp
# Opt level: O0

ostream * operator<<(ostream *os,Point *p)

{
  ostream *poVar1;
  void *this;
  double dVar2;
  Point *p_local;
  ostream *os_local;
  
  poVar1 = std::operator<<(os,"Point: ");
  dVar2 = MeshLib::Point::operator()(p,0);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,dVar2);
  poVar1 = std::operator<<(poVar1," ");
  dVar2 = MeshLib::Point::operator()(p,1);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,dVar2);
  poVar1 = std::operator<<(poVar1," ");
  dVar2 = MeshLib::Point::operator()(p,2);
  this = (void *)std::ostream::operator<<(poVar1,dVar2);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  return os;
}

Assistant:

std::ostream & operator<<( std::ostream & os, const Point & p)
{
	os << "Point: " << p(0) << " " << p(1) << " " << p(2) << std::endl;
	return os;
}